

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  uint *puVar1;
  uint uVar2;
  SPxOut *pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  pointer pnVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  fpclass_type fVar12;
  undefined8 *puVar13;
  Status **ppSVar14;
  int32_t iVar15;
  ulong uVar16;
  long lVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  long lVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> *local_100;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> local_b8;
  Status **local_78;
  Status **local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) &&
     (local_f8.data._M_elems[0] = pSVar3->m_verbosity, 4 < (int)local_f8.data._M_elems[0])) {
    local_138.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"unshifting ...",0xe);
    cVar7 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.exp = 0;
    local_138.neg = false;
    local_100 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_100,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar2 = (this->thecovectors->set).thenum;
      uVar16 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          lVar19 = uVar16 + 1;
          lVar17 = uVar16 * 0x38;
          do {
            local_b8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[lVar19 + -2].super_DataKey;
            iVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::number(&this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,(SPxId *)&local_b8);
            if ((int)local_b8.data._M_elems[0] < 0) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_f8.data._M_elems[0] = pnVar4[iVar11].m_backend.data._M_elems[0];
              local_f8.data._M_elems[9] = pnVar4[iVar11].m_backend.data._M_elems[9];
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 5;
              uVar5 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 1;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              local_f8.exp = pnVar4[iVar11].m_backend.exp;
              local_f8.fpclass = pnVar4[iVar11].m_backend.fpclass;
              local_f8.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
              local_f8.neg = (bool)((local_f8.data._M_elems[0] != 0 ||
                                    local_f8.fpclass != cpp_dec_float_finite) ^
                                   pnVar4[iVar11].m_backend.neg);
              local_f8.data._M_elems[5] = (uint)uVar5;
              local_f8.data._M_elems[6] = (uint)((ulong)uVar5 >> 0x20);
              local_f8.data._M_elems[7] = (uint)uVar8;
              local_f8.data._M_elems[8] = (uint)((ulong)uVar8 >> 0x20);
              local_f8.data._M_elems[1] = (uint)uVar9;
              local_f8.data._M_elems[2] = (uint)((ulong)uVar9 >> 0x20);
              local_f8.data._M_elems[3] = (uint)uVar10;
              local_f8.data._M_elems[4] = (uint)((ulong)uVar10 >> 0x20);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_138.data._M_elems[0] = pnVar4[iVar11].m_backend.data._M_elems[0];
              local_178.data._M_elems[8] = pnVar4[iVar11].m_backend.data._M_elems[9];
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 5;
              uVar5 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_178.data._M_elems[4] = (uint)uVar5;
              local_178.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
              local_178.data._M_elems[6] = (uint)uVar8;
              local_178.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 1;
              uVar5 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_178.data._M_elems[0] = (uint)uVar5;
              local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_178.data._M_elems[2] = (uint)uVar8;
              local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.fpclass = pnVar4[iVar11].m_backend.fpclass;
              local_138.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
              local_138.neg =
                   (bool)((local_138.data._M_elems[0] != 0 ||
                          local_138.fpclass != cpp_dec_float_finite) ^ pnVar4[iVar11].m_backend.neg)
              ;
              local_138.exp = pnVar4[iVar11].m_backend.exp;
              local_138.data._M_elems[1] = local_178.data._M_elems[0];
              local_138.data._M_elems[2] = local_178.data._M_elems[1];
              local_138.data._M_elems[3] = local_178.data._M_elems[2];
              local_138.data._M_elems[4] = local_178.data._M_elems[3];
              local_138.data._M_elems[5] = local_178.data._M_elems[4];
              local_138.data._M_elems[6] = local_178.data._M_elems[5];
              local_138.data._M_elems[7] = local_178.data._M_elems[6];
              local_138.data._M_elems[8] = local_178.data._M_elems[7];
              local_138.data._M_elems[9] = local_178.data._M_elems[8];
            }
            else {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 8);
              local_f8.data._M_elems[8] = (uint)uVar5;
              local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
              uVar5 = *(undefined8 *)&pnVar4[iVar11].m_backend.data;
              uVar8 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 2);
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 4;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              local_f8.data._M_elems[4] = (uint)uVar9;
              local_f8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_f8.data._M_elems[6] = (uint)uVar10;
              local_f8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_f8.data._M_elems[0] = (uint)uVar5;
              local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_f8.data._M_elems[2] = (uint)uVar8;
              local_f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_f8.exp = pnVar4[iVar11].m_backend.exp;
              local_f8.neg = pnVar4[iVar11].m_backend.neg;
              local_f8.fpclass = pnVar4[iVar11].m_backend.fpclass;
              local_f8.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 8);
              local_138.data._M_elems[8] = (uint)uVar5;
              local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
              uVar5 = *(undefined8 *)&pnVar4[iVar11].m_backend.data;
              uVar8 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 2);
              puVar1 = pnVar4[iVar11].m_backend.data._M_elems + 4;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              local_138.data._M_elems[4] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[6] = (uint)uVar10;
              local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[0] = (uint)uVar5;
              local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_138.data._M_elems[2] = (uint)uVar8;
              local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.exp = pnVar4[iVar11].m_backend.exp;
              local_138.neg = pnVar4[iVar11].m_backend.neg;
              local_138.fpclass = pnVar4[iVar11].m_backend.fpclass;
              local_138.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
            }
            if (((local_f8.fpclass == cpp_dec_float_NaN) || (local_138.fpclass == cpp_dec_float_NaN)
                ) || (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_f8,&local_138), iVar11 != 0)) {
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[6] = local_f8.data._M_elems[6];
              local_178.data._M_elems[7] = local_f8.data._M_elems[7];
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.exp = local_f8.exp;
              local_178.neg = local_f8.neg;
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_178,&local_68);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                    == 2) || (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar17),&local_178), -1 < iVar11)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                      != 2) && (local_f8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar17),&local_f8), 0 < iVar11)) {
                  pnVar4 = (this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    local_178.data._M_elems[8] = (uint)puVar13[4];
                    local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                    local_178.data._M_elems[4] = (uint)puVar13[2];
                    local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                    local_178.data._M_elems[6] = (uint)puVar13[3];
                    local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                    local_178.data._M_elems[0] = (uint)*puVar13;
                    local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                    local_178.data._M_elems[2] = (uint)puVar13[1];
                    local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                    local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                    local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_f8);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_100,&local_178);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x20) =
                     CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x10);
                *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17) = local_f8.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U) = local_f8.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) =
                     local_f8._48_8_;
              }
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_138.data._M_elems[8];
              local_178.data._M_elems[9] = local_138.data._M_elems[9];
              local_178.data._M_elems[4] = local_138.data._M_elems[4];
              local_178.data._M_elems[5] = local_138.data._M_elems[5];
              local_178.data._M_elems[6] = local_138.data._M_elems[6];
              local_178.data._M_elems[7] = local_138.data._M_elems[7];
              local_178.data._M_elems[0] = local_138.data._M_elems[0];
              local_178.data._M_elems[1] = local_138.data._M_elems[1];
              local_178.data._M_elems[2] = local_138.data._M_elems[2];
              local_178.data._M_elems[3] = local_138.data._M_elems[3];
              local_178.exp = local_138.exp;
              local_178.neg = local_138.neg;
              local_178.fpclass = local_138.fpclass;
              local_178.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_68);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                    == 2) || (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar17),&local_178), iVar11 < 1)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                      != 2) && (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar17),&local_138), iVar11 < 0)) {
                  pnVar4 = (this->theLBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    local_178.data._M_elems[8] = (uint)puVar13[4];
                    local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                    local_178.data._M_elems[4] = (uint)puVar13[2];
                    local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                    local_178.data._M_elems[6] = (uint)puVar13[3];
                    local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                    local_178.data._M_elems[0] = (uint)*puVar13;
                    local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                    local_178.data._M_elems[2] = (uint)puVar13[1];
                    local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                    local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                    local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_138);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (local_100,&local_178);
                }
              }
              else {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x20) =
                     CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x10);
                *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17) = local_138.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U) = local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) =
                     local_138._48_8_;
              }
            }
            else {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) == 2) ||
                  (local_f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),&local_f8)
                 , iVar11 < 1)) {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) == 2) ||
                    (local_138.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),
                                        &local_138), -1 < iVar11)) goto LAB_00239341;
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLBbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 != &local_178) {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  goto LAB_0023932f;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_138);
                if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
                  local_178.neg = (bool)(local_178.neg ^ 1);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  local_178.data._M_elems[8] = (uint)puVar13[4];
                  local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                  local_178.data._M_elems[4] = (uint)puVar13[2];
                  local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                  local_178.data._M_elems[6] = (uint)puVar13[3];
                  local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                  local_178.data._M_elems[0] = (uint)*puVar13;
                  local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                  local_178.data._M_elems[2] = (uint)puVar13[1];
                  local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                  local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                  local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                  local_178._48_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                }
                pcVar18 = &local_f8;
LAB_0023932f:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_100,&local_178);
            }
LAB_00239341:
            lVar19 = lVar19 + -1;
            lVar17 = lVar17 + -0x38;
          } while (1 < lVar19);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 * 0x38;
          lVar17 = lVar17 + 1;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar17 + -2] < 1) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_f8.data._M_elems[0] =
                   *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
              local_f8.data._M_elems[9] =
                   *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14);
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
              uVar5 = *puVar13;
              uVar8 = puVar13[1];
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
              uVar9 = *puVar13;
              uVar10 = puVar13[1];
              local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
              local_f8._48_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
              local_f8.neg = (bool)((local_f8.data._M_elems[0] != 0 ||
                                    local_f8.fpclass != cpp_dec_float_finite) ^
                                   *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc
                                            ));
              local_f8.data._M_elems[5] = (uint)uVar5;
              local_f8.data._M_elems[6] = (uint)((ulong)uVar5 >> 0x20);
              local_f8.data._M_elems[7] = (uint)uVar8;
              local_f8.data._M_elems[8] = (uint)((ulong)uVar8 >> 0x20);
              local_f8.data._M_elems[1] = (uint)uVar9;
              local_f8.data._M_elems[2] = (uint)((ulong)uVar9 >> 0x20);
              local_f8.data._M_elems[3] = (uint)uVar10;
              local_f8.data._M_elems[4] = (uint)((ulong)uVar10 >> 0x20);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_138.data._M_elems[0] =
                   *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
              local_178.data._M_elems[8] =
                   *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14);
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
              uVar5 = *puVar13;
              uVar8 = puVar13[1];
              local_178.data._M_elems[4] = (uint)uVar5;
              local_178.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
              local_178.data._M_elems[6] = (uint)uVar8;
              local_178.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
              uVar5 = *puVar13;
              uVar8 = puVar13[1];
              local_178.data._M_elems[0] = (uint)uVar5;
              local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_178.data._M_elems[2] = (uint)uVar8;
              local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
              local_138._48_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
              local_138.neg =
                   (bool)((local_138.data._M_elems[0] != 0 ||
                          local_138.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc));
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_138.data._M_elems[1] = local_178.data._M_elems[0];
              local_138.data._M_elems[2] = local_178.data._M_elems[1];
              local_138.data._M_elems[3] = local_178.data._M_elems[2];
              local_138.data._M_elems[4] = local_178.data._M_elems[3];
              local_138.data._M_elems[5] = local_178.data._M_elems[4];
              local_138.data._M_elems[6] = local_178.data._M_elems[5];
              local_138.data._M_elems[7] = local_178.data._M_elems[6];
              local_138.data._M_elems[8] = local_178.data._M_elems[7];
              local_138.data._M_elems[9] = local_178.data._M_elems[8];
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                  (local_f8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),&local_f8)
                 , 0 < iVar11)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_138,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar11)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 == &local_178) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_138);
                  if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite)
                  {
                    local_178.neg = (bool)(local_178.neg ^ 1);
                  }
                }
                else {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,pcVar18);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 * 0x38;
          lVar17 = lVar17 + 1;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar17 + -2] < 1) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
              local_f8.data._M_elems[8] = (uint)uVar5;
              local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
              puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
              uVar5 = *puVar13;
              uVar8 = puVar13[1];
              puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
              uVar9 = *puVar13;
              uVar10 = puVar13[1];
              local_f8.data._M_elems[4] = (uint)uVar9;
              local_f8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_f8.data._M_elems[6] = (uint)uVar10;
              local_f8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_f8.data._M_elems[0] = (uint)uVar5;
              local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_f8.data._M_elems[2] = (uint)uVar8;
              local_f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
              local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
              local_f8._48_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
              local_138.data._M_elems[8] = (uint)uVar5;
              local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
              puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
              uVar5 = *puVar13;
              uVar8 = puVar13[1];
              puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
              uVar9 = *puVar13;
              uVar10 = puVar13[1];
              local_138.data._M_elems[4] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[6] = (uint)uVar10;
              local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[0] = (uint)uVar5;
              local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
              local_138.data._M_elems[2] = (uint)uVar8;
              local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
              local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
              local_138._48_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                  (local_f8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),&local_f8)
                 , 0 < iVar11)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_138,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar11)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 == &local_178) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_138);
                  if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite)
                  {
                    local_178.neg = (bool)(local_178.neg ^ 1);
                  }
                }
                else {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,pcVar18);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar19 = uVar16 + 1;
          local_70 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
          local_78 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
          lVar17 = uVar16 * 0x38;
          do {
            local_b8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[lVar19 + -2].super_DataKey;
            iVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::number(&this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,(SPxId *)&local_b8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_138,0);
            local_f8.data._M_elems[0] = local_138.data._M_elems[0];
            local_f8.data._M_elems[1] = local_138.data._M_elems[1];
            local_f8.data._M_elems[2] = local_138.data._M_elems[2];
            local_f8.data._M_elems[3] = local_138.data._M_elems[3];
            local_f8.data._M_elems[4] = local_138.data._M_elems[4];
            local_f8.data._M_elems[5] = local_138.data._M_elems[5];
            local_f8.data._M_elems[6] = local_138.data._M_elems[6];
            local_f8.data._M_elems[7] = local_138.data._M_elems[7];
            local_f8.data._M_elems[8] = local_138.data._M_elems[8];
            local_f8.data._M_elems[9] = local_138.data._M_elems[9];
            local_f8.exp = local_138.exp;
            local_f8.neg = local_138.neg;
            local_f8.fpclass = local_138.fpclass;
            local_f8.prec_elem = local_138.prec_elem;
            ppSVar14 = local_70;
            if ((int)local_b8.data._M_elems[0] < 0) {
              ppSVar14 = local_78;
            }
            clearDualBounds(this,(*ppSVar14)[iVar11],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138);
            pnVar4 = (this->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) == 2) ||
                (pnVar6 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar17 + 8U) == 2)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),
                                    (cpp_dec_float<50U,_int,_void> *)
                                    ((long)pnVar6[-1].m_backend.data._M_elems + lVar17)),
               iVar11 != 0)) {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) == 2) ||
                  (local_f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),&local_f8)
                 , iVar11 < 1)) {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  local_178.data._M_elems[8] = (uint)puVar13[4];
                  local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                  local_178.data._M_elems[4] = (uint)puVar13[2];
                  local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                  local_178.data._M_elems[6] = (uint)puVar13[3];
                  local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                  local_178.data._M_elems[0] = (uint)*puVar13;
                  local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                  local_178.data._M_elems[2] = (uint)puVar13[1];
                  local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                  local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                  local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                  local_178._48_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                }
                pcVar18 = &local_f8;
LAB_0023aa90:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (local_100,&local_178);
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  local_178.data._M_elems[8] = (uint)puVar13[4];
                  local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                  local_178.data._M_elems[4] = (uint)puVar13[2];
                  local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                  local_178.data._M_elems[6] = (uint)puVar13[3];
                  local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                  local_178.data._M_elems[0] = (uint)*puVar13;
                  local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                  local_178.data._M_elems[2] = (uint)puVar13[1];
                  local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                  local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                  local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                  local_178._48_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            else {
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[6] = local_f8.data._M_elems[6];
              local_178.data._M_elems[7] = local_f8.data._M_elems[7];
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.exp = local_f8.exp;
              local_178.neg = local_f8.neg;
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_68);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                    == 2) || (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar17),&local_178), -1 < iVar11)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                      != 2) && (local_f8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar17),&local_f8), 0 < iVar11)) {
                  pnVar4 = (this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    local_178.data._M_elems[8] = (uint)puVar13[4];
                    local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                    local_178.data._M_elems[4] = (uint)puVar13[2];
                    local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                    local_178.data._M_elems[6] = (uint)puVar13[3];
                    local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                    local_178.data._M_elems[0] = (uint)*puVar13;
                    local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                    local_178.data._M_elems[2] = (uint)puVar13[1];
                    local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                    local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                    local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_f8);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_100,&local_178);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x20) =
                     CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x10);
                *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17) = local_f8.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U) = local_f8.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) =
                     local_f8._48_8_;
              }
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_138.data._M_elems[8];
              local_178.data._M_elems[9] = local_138.data._M_elems[9];
              local_178.data._M_elems[4] = local_138.data._M_elems[4];
              local_178.data._M_elems[5] = local_138.data._M_elems[5];
              local_178.data._M_elems[6] = local_138.data._M_elems[6];
              local_178.data._M_elems[7] = local_138.data._M_elems[7];
              local_178.data._M_elems[0] = local_138.data._M_elems[0];
              local_178.data._M_elems[1] = local_138.data._M_elems[1];
              local_178.data._M_elems[2] = local_138.data._M_elems[2];
              local_178.data._M_elems[3] = local_138.data._M_elems[3];
              local_178.exp = local_138.exp;
              local_178.neg = local_138.neg;
              local_178.fpclass = local_138.fpclass;
              local_178.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_178,&local_68);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                    == 2) || (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar17),&local_178), iVar11 < 1)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar17 + 8U)
                      != 2) && (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar17),&local_138), iVar11 < 0)) {
                  pnVar4 = (this->theLBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    local_178.data._M_elems[8] = (uint)puVar13[4];
                    local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                    local_178.data._M_elems[4] = (uint)puVar13[2];
                    local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                    local_178.data._M_elems[6] = (uint)puVar13[3];
                    local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                    local_178.data._M_elems[0] = (uint)*puVar13;
                    local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                    local_178.data._M_elems[2] = (uint)puVar13[1];
                    local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                    local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                    local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                  }
                  pcVar18 = &local_138;
                  goto LAB_0023aa90;
                }
              }
              else {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x20) =
                     CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17 + 0x10);
                *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17) = local_138.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U) = local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) =
                     local_138._48_8_;
              }
            }
            lVar19 = lVar19 + -1;
            lVar17 = lVar17 + -0x38;
          } while (1 < lVar19);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 + 1;
          lVar17 = lVar17 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar19 + -2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&local_138,0);
              local_f8.data._M_elems[0] = local_138.data._M_elems[0];
              local_f8.data._M_elems[1] = local_138.data._M_elems[1];
              local_f8.data._M_elems[2] = local_138.data._M_elems[2];
              local_f8.data._M_elems[3] = local_138.data._M_elems[3];
              local_f8.data._M_elems[4] = local_138.data._M_elems[4];
              local_f8.data._M_elems[5] = local_138.data._M_elems[5];
              local_f8.data._M_elems[6] = local_138.data._M_elems[6];
              local_f8.data._M_elems[7] = local_138.data._M_elems[7];
              local_f8.data._M_elems[8] = local_138.data._M_elems[8];
              local_f8.data._M_elems[9] = local_138.data._M_elems[9];
              local_f8.exp = local_138.exp;
              local_f8.neg = local_138.neg;
              local_f8.fpclass = local_138.fpclass;
              local_f8.prec_elem = local_138.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.rowstat.data[lVar19 + -2],
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138);
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) != 2) &&
                  (local_f8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),&local_f8)
                 , 0 < iVar11)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  local_178.data._M_elems[8] = (uint)puVar13[4];
                  local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                  local_178.data._M_elems[4] = (uint)puVar13[2];
                  local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                  local_178.data._M_elems[6] = (uint)puVar13[3];
                  local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                  local_178.data._M_elems[0] = (uint)*puVar13;
                  local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                  local_178.data._M_elems[2] = (uint)puVar13[1];
                  local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                  local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                  local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                  local_178._48_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) != 2)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_138,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17)),
                 0 < iVar11)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 == &local_178) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_138);
                  if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite)
                  {
                    local_178.neg = (bool)(local_178.neg ^ 1);
                  }
                }
                else {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,pcVar18);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            lVar19 = lVar19 + -1;
            lVar17 = lVar17 + -0x38;
          } while (1 < lVar19);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 + 1;
          lVar17 = lVar17 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar19 + -2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&local_138,0);
              local_f8.data._M_elems[0] = local_138.data._M_elems[0];
              local_f8.data._M_elems[1] = local_138.data._M_elems[1];
              local_f8.data._M_elems[2] = local_138.data._M_elems[2];
              local_f8.data._M_elems[3] = local_138.data._M_elems[3];
              local_f8.data._M_elems[4] = local_138.data._M_elems[4];
              local_f8.data._M_elems[5] = local_138.data._M_elems[5];
              local_f8.data._M_elems[6] = local_138.data._M_elems[6];
              local_f8.data._M_elems[7] = local_138.data._M_elems[7];
              local_f8.data._M_elems[8] = local_138.data._M_elems[8];
              local_f8.data._M_elems[9] = local_138.data._M_elems[9];
              local_f8.exp = local_138.exp;
              local_f8.neg = local_138.neg;
              local_f8.fpclass = local_138.fpclass;
              local_f8.prec_elem = local_138.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.colstat.data[lVar19 + -2],
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138);
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) != 2) &&
                  (local_f8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17),&local_f8)
                 , 0 < iVar11)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  local_178.data._M_elems[8] = (uint)puVar13[4];
                  local_178.data._M_elems[9] = (uint)((ulong)puVar13[4] >> 0x20);
                  local_178.data._M_elems[4] = (uint)puVar13[2];
                  local_178.data._M_elems[5] = (uint)((ulong)puVar13[2] >> 0x20);
                  local_178.data._M_elems[6] = (uint)puVar13[3];
                  local_178.data._M_elems[7] = (uint)((ulong)puVar13[3] >> 0x20);
                  local_178.data._M_elems[0] = (uint)*puVar13;
                  local_178.data._M_elems[1] = (uint)((ulong)*puVar13 >> 0x20);
                  local_178.data._M_elems[2] = (uint)puVar13[1];
                  local_178.data._M_elems[3] = (uint)((ulong)puVar13[1] >> 0x20);
                  local_178.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17);
                  local_178.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 4U);
                  local_178._48_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar17 + 8U) != 2)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_138,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar17)),
                 0 < iVar11)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar17);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 == &local_178) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_138);
                  if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite)
                  {
                    local_178.neg = (bool)(local_178.neg ^ 1);
                  }
                }
                else {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,pcVar18);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            lVar19 = lVar19 + -1;
            lVar17 = lVar17 + -0x38;
          } while (1 < lVar19);
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar16 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          lVar19 = uVar16 * 0x38;
          lVar17 = uVar16 + 1;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
            local_138.data._M_elems[8] = (uint)uVar5;
            local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
            uVar9 = *puVar13;
            uVar10 = puVar13[1];
            local_138.data._M_elems[4] = (uint)uVar9;
            local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar10;
            local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_138.data._M_elems[0] = (uint)uVar5;
            local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar8;
            local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
            local_138.fpclass =
                 *(fpclass_type *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
            local_138.prec_elem =
                 *(int32_t *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -4);
            local_f8.prec_elem = local_138.prec_elem;
            local_f8.fpclass = local_138.fpclass;
            local_f8.data._M_elems[0] = local_138.data._M_elems[0];
            local_f8.data._M_elems[1] = local_138.data._M_elems[1];
            local_f8.data._M_elems[2] = local_138.data._M_elems[2];
            local_f8.data._M_elems[3] = local_138.data._M_elems[3];
            local_f8.data._M_elems[4] = local_138.data._M_elems[4];
            local_f8.data._M_elems[5] = local_138.data._M_elems[5];
            local_f8.data._M_elems[6] = local_138.data._M_elems[6];
            local_f8.data._M_elems[7] = local_138.data._M_elems[7];
            local_f8.data._M_elems[8] = local_138.data._M_elems[8];
            local_f8.data._M_elems[9] = local_138.data._M_elems[9];
            local_f8.exp = local_138.exp;
            local_f8.neg = local_138.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[lVar17 + -2],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138);
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar17 + -2] < 1) {
              pnVar4 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[6] = local_f8.data._M_elems[6];
              local_178.data._M_elems[7] = local_f8.data._M_elems[7];
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.exp = local_f8.exp;
              local_178.neg = local_f8.neg;
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_178,&local_68);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_178), -1 < iVar11)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                     CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_f8.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_f8._48_8_;
                if (((local_f8.fpclass != cpp_dec_float_NaN) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_f8,&local_138), iVar11 == 0)) {
                  pnVar4 = (this->theLRbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                       CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                  puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                  puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                  *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                  puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp
                  ;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_138.neg
                  ;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                       local_138._48_8_;
                }
              }
              pnVar4 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[8] = local_138.data._M_elems[8];
              local_178.data._M_elems[9] = local_138.data._M_elems[9];
              local_178.data._M_elems[4] = local_138.data._M_elems[4];
              local_178.data._M_elems[5] = local_138.data._M_elems[5];
              local_178.data._M_elems[6] = local_138.data._M_elems[6];
              local_178.data._M_elems[7] = local_138.data._M_elems[7];
              local_178.data._M_elems[0] = local_138.data._M_elems[0];
              local_178.data._M_elems[1] = local_138.data._M_elems[1];
              local_178.data._M_elems[2] = local_138.data._M_elems[2];
              local_178.data._M_elems[3] = local_138.data._M_elems[3];
              local_178.exp = local_138.exp;
              local_178.neg = local_138.neg;
              local_178.fpclass = local_138.fpclass;
              local_178.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_68);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_178), iVar11 < 1)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                if (pcVar18 == &local_178) goto LAB_0023887c;
LAB_00238b70:
                local_178.data._M_elems[8] = local_138.data._M_elems[8];
                local_178.data._M_elems[9] = local_138.data._M_elems[9];
                local_178.data._M_elems[4] = local_138.data._M_elems[4];
                local_178.data._M_elems[5] = local_138.data._M_elems[5];
                local_178.data._M_elems[6] = local_138.data._M_elems[6];
                local_178.data._M_elems[7] = local_138.data._M_elems[7];
                local_178.data._M_elems[0] = local_138.data._M_elems[0];
                local_178.data._M_elems[1] = local_138.data._M_elems[1];
                local_178.data._M_elems[2] = local_138.data._M_elems[2];
                local_178.data._M_elems[3] = local_138.data._M_elems[3];
                local_178.exp = local_138.exp;
                local_178.neg = local_138.neg;
                local_178.fpclass = local_138.fpclass;
                local_178.prec_elem = local_138.prec_elem;
                goto LAB_00238baa;
              }
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
              *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
              *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp;
              *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_138.neg;
              *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                   local_138._48_8_;
              if (((local_f8.fpclass != cpp_dec_float_NaN) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_f8,&local_138), iVar11 == 0)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                     CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_f8.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_f8._48_8_;
              }
            }
            else {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),&local_f8)
                 , iVar11 < 1)) {
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_138.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),
                                        &local_138), -1 < iVar11)) goto LAB_00238bbc;
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                if (pcVar18 != &local_178) goto LAB_00238b70;
LAB_0023887c:
                local_178.data._M_elems[9] = 0;
                local_178.neg = false;
                local_178.exp = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_138);
                if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
                  local_178.neg = (bool)(local_178.neg ^ 1);
                }
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                pcVar18 = &local_f8;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_00238baa:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_100,&local_178);
            }
LAB_00238bbc:
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 * 0x38;
          lVar17 = lVar17 + 1;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_138.data._M_elems[0] =
                 *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            local_178.data._M_elems[8] =
                 *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14);
            puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            local_178.data._M_elems[4] = (uint)uVar5;
            local_178.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
            local_178.data._M_elems[6] = (uint)uVar8;
            local_178.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            local_178.data._M_elems[0] = (uint)uVar5;
            local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_178.data._M_elems[2] = (uint)uVar8;
            local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_138.fpclass =
                 *(fpclass_type *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
            local_138.prec_elem =
                 *(int32_t *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -4);
            local_138.neg =
                 (bool)((local_138.data._M_elems[0] != 0 ||
                        local_138.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc));
            local_f8.data._M_elems[3] = local_178.data._M_elems[2];
            local_f8.data._M_elems[4] = local_178.data._M_elems[3];
            local_f8.data._M_elems[5] = local_178.data._M_elems[4];
            local_f8.data._M_elems[6] = local_178.data._M_elems[5];
            local_f8.data._M_elems[7] = local_178.data._M_elems[6];
            local_f8.data._M_elems[8] = local_178.data._M_elems[7];
            local_f8.prec_elem = local_138.prec_elem;
            local_f8.fpclass = local_138.fpclass;
            local_138.data._M_elems[1] = local_178.data._M_elems[0];
            local_138.data._M_elems[2] = local_178.data._M_elems[1];
            local_138.data._M_elems[3] = local_178.data._M_elems[2];
            local_138.data._M_elems[4] = local_178.data._M_elems[3];
            local_138.data._M_elems[5] = local_178.data._M_elems[4];
            local_138.data._M_elems[6] = local_178.data._M_elems[5];
            local_138.data._M_elems[7] = local_178.data._M_elems[6];
            local_138.data._M_elems[8] = local_178.data._M_elems[7];
            local_138.data._M_elems[9] = local_178.data._M_elems[8];
            local_f8.data._M_elems[0] = local_138.data._M_elems[0];
            local_f8.data._M_elems[1] = local_178.data._M_elems[0];
            local_f8.data._M_elems[2] = local_178.data._M_elems[1];
            local_f8.data._M_elems[9] = local_178.data._M_elems[8];
            local_f8.exp = local_138.exp;
            local_f8.neg = local_138.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[lVar17 + -2],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8);
            fVar12 = local_f8.fpclass;
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar17 + -2] < 1) {
              pnVar4 = (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[6] = local_f8.data._M_elems[6];
              local_178.data._M_elems[7] = local_f8.data._M_elems[7];
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.exp = local_f8.exp;
              local_178.neg =
                   (bool)((local_f8.data._M_elems[0] != 0 || fVar12 != cpp_dec_float_finite) ^
                         local_f8.neg);
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_178,&local_68);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_178), -1 < iVar11)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_b8.data._M_elems[1] = local_f8.data._M_elems[1];
                local_b8.data._M_elems[0] = local_f8.data._M_elems[0];
                local_b8.data._M_elems[3] = local_f8.data._M_elems[3];
                local_b8.data._M_elems[2] = local_f8.data._M_elems[2];
                local_b8.data._M_elems[5] = local_f8.data._M_elems[5];
                local_b8.data._M_elems[4] = local_f8.data._M_elems[4];
                local_b8.data._M_elems[7] = local_f8.data._M_elems[7];
                local_b8.data._M_elems[6] = local_f8.data._M_elems[6];
                local_b8.data._M_elems[9] = local_f8.data._M_elems[9];
                local_b8.data._M_elems[8] = local_f8.data._M_elems[8];
                local_b8.exp = local_f8.exp;
                local_b8.neg = local_f8.neg;
                local_b8.fpclass = local_f8.fpclass;
                local_b8.prec_elem = local_f8.prec_elem;
                if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
                  local_b8.neg = (bool)(local_f8.neg ^ 1);
                }
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_b8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
              else {
                local_178.data._M_elems[0] = local_f8.data._M_elems[1];
                local_178.data._M_elems[1] = local_f8.data._M_elems[2];
                local_178.data._M_elems[2] = local_f8.data._M_elems[3];
                local_178.data._M_elems[3] = local_f8.data._M_elems[4];
                local_178.data._M_elems[4] = local_f8.data._M_elems[5];
                local_178.data._M_elems[5] = local_f8.data._M_elems[6];
                local_178.data._M_elems[6] = local_f8.data._M_elems[7];
                local_178.data._M_elems[7] = local_f8.data._M_elems[8];
                local_178.data._M_elems[8] = local_f8.data._M_elems[9];
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19) =
                     local_f8.data._M_elems[0];
                puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
                *puVar13 = CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
                puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
                *puVar13 = CONCAT44(local_f8.data._M_elems[6],local_f8.data._M_elems[5]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[8],local_f8.data._M_elems[7]);
                *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14) =
                     local_f8.data._M_elems[9];
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) =
                     (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) ^
                     local_f8.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_f8._48_8_;
                if (((local_f8.fpclass != cpp_dec_float_NaN) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_f8,&local_138), iVar11 == 0)) {
                  pnVar4 = (this->theLCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19) =
                       local_138.data._M_elems[0];
                  puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34)
                  ;
                  *puVar13 = CONCAT44(local_138.data._M_elems[2],local_138.data._M_elems[1]);
                  puVar13[1] = CONCAT44(local_138.data._M_elems[4],local_138.data._M_elems[3]);
                  puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24)
                  ;
                  *puVar13 = CONCAT44(local_138.data._M_elems[6],local_138.data._M_elems[5]);
                  puVar13[1] = CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]);
                  *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14) =
                       local_138.data._M_elems[9];
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp
                  ;
                  *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) =
                       (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite
                       ) ^ local_138.neg;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                       local_138._48_8_;
                }
              }
              pnVar4 = (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[0] = local_138.data._M_elems[0];
              local_178.data._M_elems[9] = local_138.data._M_elems[9];
              local_178.data._M_elems[5] = local_138.data._M_elems[5];
              local_178.data._M_elems[6] = local_138.data._M_elems[6];
              local_178.data._M_elems[7] = local_138.data._M_elems[7];
              local_178.data._M_elems[8] = local_138.data._M_elems[8];
              local_178.data._M_elems[1] = local_138.data._M_elems[1];
              local_178.data._M_elems[2] = local_138.data._M_elems[2];
              local_178.data._M_elems[3] = local_138.data._M_elems[3];
              local_178.data._M_elems[4] = local_138.data._M_elems[4];
              local_178.exp = local_138.exp;
              local_178.neg =
                   (bool)((local_138.data._M_elems[0] != 0 ||
                          local_138.fpclass != cpp_dec_float_finite) ^ local_138.neg);
              local_178.fpclass = local_138.fpclass;
              local_178.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_68);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_178.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_178), iVar11 < 1)) {
                local_b8.data._M_elems[1] = local_138.data._M_elems[1];
                local_b8.data._M_elems[0] = local_138.data._M_elems[0];
                local_b8.data._M_elems[3] = local_138.data._M_elems[3];
                local_b8.data._M_elems[2] = local_138.data._M_elems[2];
                local_b8.data._M_elems[5] = local_138.data._M_elems[5];
                local_b8.data._M_elems[4] = local_138.data._M_elems[4];
                local_b8.data._M_elems[7] = local_138.data._M_elems[7];
                local_b8.data._M_elems[6] = local_138.data._M_elems[6];
                local_b8.data._M_elems[9] = local_138.data._M_elems[9];
                local_b8.data._M_elems[8] = local_138.data._M_elems[8];
                local_b8.exp = local_138.exp;
                local_b8.neg = local_138.neg;
                fVar12 = local_138.fpclass;
                iVar15 = local_138.prec_elem;
                local_b8.fpclass = local_138.fpclass;
                local_b8.prec_elem = local_138.prec_elem;
                if (local_138.data._M_elems[0] != 0 || fVar12 != cpp_dec_float_finite) {
LAB_0023a09f:
                  local_b8.neg = (bool)(local_138.neg ^ 1);
                  local_b8.exp = local_138.exp;
                  local_b8._48_8_ = local_138._48_8_;
                }
LAB_0023a0ab:
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                local_138.exp = local_b8.exp;
                local_138._48_8_ = local_b8._48_8_;
                if (pcVar18 != &local_178) {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.neg = local_b8.neg;
                  local_178.prec_elem = iVar15;
                  local_178.fpclass = fVar12;
                  local_178.exp = local_b8.exp;
                  goto LAB_0023a115;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_b8);
                if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
                  local_178.neg = (bool)(local_178.neg ^ 1);
                }
                goto LAB_0023a11a;
              }
              local_178.data._M_elems[0] = local_138.data._M_elems[1];
              local_178.data._M_elems[1] = local_138.data._M_elems[2];
              local_178.data._M_elems[2] = local_138.data._M_elems[3];
              local_178.data._M_elems[3] = local_138.data._M_elems[4];
              local_178.data._M_elems[4] = local_138.data._M_elems[5];
              local_178.data._M_elems[5] = local_138.data._M_elems[6];
              local_178.data._M_elems[6] = local_138.data._M_elems[7];
              local_178.data._M_elems[7] = local_138.data._M_elems[8];
              local_178.data._M_elems[8] = local_138.data._M_elems[9];
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19) =
                   local_138.data._M_elems[0];
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
              *puVar13 = CONCAT44(local_138.data._M_elems[2],local_138.data._M_elems[1]);
              puVar13[1] = CONCAT44(local_138.data._M_elems[4],local_138.data._M_elems[3]);
              puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
              *puVar13 = CONCAT44(local_138.data._M_elems[6],local_138.data._M_elems[5]);
              puVar13[1] = CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]);
              *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14) =
                   local_138.data._M_elems[9];
              *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp;
              *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) =
                   (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) ^
                   local_138.neg;
              *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                   local_138._48_8_;
              if (((local_f8.fpclass != cpp_dec_float_NaN) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_f8,&local_138), iVar11 == 0)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19) =
                     local_f8.data._M_elems[0];
                puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x34);
                *puVar13 = CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
                puVar13 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x24);
                *puVar13 = CONCAT44(local_f8.data._M_elems[6],local_f8.data._M_elems[5]);
                puVar13[1] = CONCAT44(local_f8.data._M_elems[8],local_f8.data._M_elems[7]);
                *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x14) =
                     local_f8.data._M_elems[9];
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) =
                     (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) ^
                     local_f8.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_f8._48_8_;
              }
            }
            else {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[6] = local_f8.data._M_elems[6];
              local_178.data._M_elems[7] = local_f8.data._M_elems[7];
              local_178.exp = local_f8.exp;
              local_178.neg = local_f8.neg;
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              if (local_f8.data._M_elems[0] != 0 || fVar12 != cpp_dec_float_finite) {
                local_178.neg = (bool)(local_f8.neg ^ 1);
              }
              if (((fVar12 == cpp_dec_float_NaN) ||
                  (*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),&local_178
                                     ), iVar11 < 1)) {
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_178.data._M_elems[0] = local_138.data._M_elems[0];
                local_178.data._M_elems[1] = local_138.data._M_elems[1];
                local_178.data._M_elems[2] = local_138.data._M_elems[2];
                local_178.data._M_elems[3] = local_138.data._M_elems[3];
                local_178.data._M_elems[8] = local_138.data._M_elems[8];
                local_178.data._M_elems[9] = local_138.data._M_elems[9];
                local_178.data._M_elems[4] = local_138.data._M_elems[4];
                local_178.data._M_elems[5] = local_138.data._M_elems[5];
                local_178.data._M_elems[6] = local_138.data._M_elems[6];
                local_178.data._M_elems[7] = local_138.data._M_elems[7];
                local_178.exp = local_138.exp;
                local_178.neg = local_138.neg;
                local_178.fpclass = local_138.fpclass;
                local_178.prec_elem = local_138.prec_elem;
                if (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) {
                  local_178.neg = (bool)(local_138.neg ^ 1);
                }
                if (((local_138.fpclass != cpp_dec_float_NaN) &&
                    (*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),
                                        &local_178), iVar11 < 0)) {
                  local_b8.data._M_elems[1] = local_138.data._M_elems[1];
                  local_b8.data._M_elems[0] = local_138.data._M_elems[0];
                  local_b8.data._M_elems[3] = local_138.data._M_elems[3];
                  local_b8.data._M_elems[2] = local_138.data._M_elems[2];
                  local_b8.data._M_elems[5] = local_138.data._M_elems[5];
                  local_b8.data._M_elems[4] = local_138.data._M_elems[4];
                  local_b8.data._M_elems[7] = local_138.data._M_elems[7];
                  local_b8.data._M_elems[6] = local_138.data._M_elems[6];
                  local_b8.data._M_elems[9] = local_138.data._M_elems[9];
                  local_b8.data._M_elems[8] = local_138.data._M_elems[8];
                  local_b8.exp = local_138.exp;
                  local_b8.neg = local_138.neg;
                  fVar12 = local_138.fpclass;
                  iVar15 = local_138.prec_elem;
                  local_b8.fpclass = local_138.fpclass;
                  local_b8.prec_elem = local_138.prec_elem;
                  if (local_138.data._M_elems[0] != 0 || fVar12 != cpp_dec_float_finite)
                  goto LAB_0023a09f;
                  goto LAB_0023a0ab;
                }
              }
              else {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_b8.data._M_elems[1] = local_f8.data._M_elems[1];
                local_b8.data._M_elems[0] = local_f8.data._M_elems[0];
                local_b8.data._M_elems[3] = local_f8.data._M_elems[3];
                local_b8.data._M_elems[2] = local_f8.data._M_elems[2];
                local_b8.data._M_elems[5] = local_f8.data._M_elems[5];
                local_b8.data._M_elems[4] = local_f8.data._M_elems[4];
                local_b8.data._M_elems[7] = local_f8.data._M_elems[7];
                local_b8.data._M_elems[6] = local_f8.data._M_elems[6];
                local_b8.data._M_elems[9] = local_f8.data._M_elems[9];
                local_b8.data._M_elems[8] = local_f8.data._M_elems[8];
                local_b8.exp = local_f8.exp;
                local_b8.neg = local_f8.neg;
                local_b8.fpclass = local_f8.fpclass;
                local_b8.prec_elem = local_f8.prec_elem;
                if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
                  local_b8.neg = (bool)(local_f8.neg ^ 1);
                }
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
                pcVar18 = &local_b8;
LAB_0023a115:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
LAB_0023a11a:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_100,&local_178);
              }
            }
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar19 = uVar16 * 0x38;
          lVar17 = uVar16 + 1;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
            local_f8.data._M_elems[8] = (uint)uVar5;
            local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
            uVar9 = *puVar13;
            uVar10 = puVar13[1];
            local_f8.data._M_elems[4] = (uint)uVar9;
            local_f8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_f8.data._M_elems[6] = (uint)uVar10;
            local_f8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            pcVar18 = &local_f8;
            local_f8.data._M_elems[0] = (uint)uVar5;
            local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[2] = (uint)uVar8;
            local_f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
            local_f8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8)
            ;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
            local_138.data._M_elems[8] = (uint)uVar5;
            local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
            uVar9 = *puVar13;
            uVar10 = puVar13[1];
            local_138.data._M_elems[4] = (uint)uVar9;
            local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar10;
            local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_138.data._M_elems[0] = (uint)uVar5;
            local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar8;
            local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
            local_138._48_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
            if (((local_f8.fpclass == cpp_dec_float_NaN) || (local_138.fpclass == cpp_dec_float_NaN)
                ) || (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar18,&local_138), iVar11 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[lVar17 + -2] < 1) {
                pnVar4 = (this->thePvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_178.data._M_elems[8] = local_f8.data._M_elems[8];
                local_178.data._M_elems[9] = local_f8.data._M_elems[9];
                local_178.data._M_elems[4] = local_f8.data._M_elems[4];
                local_178.data._M_elems[5] = local_f8.data._M_elems[5];
                local_178.data._M_elems[6] = local_f8.data._M_elems[6];
                local_178.data._M_elems[7] = local_f8.data._M_elems[7];
                local_178.data._M_elems[0] = local_f8.data._M_elems[0];
                local_178.data._M_elems[1] = local_f8.data._M_elems[1];
                local_178.data._M_elems[2] = local_f8.data._M_elems[2];
                local_178.data._M_elems[3] = local_f8.data._M_elems[3];
                local_178.exp = local_f8.exp;
                local_178.neg = local_f8.neg;
                local_178.fpclass = local_f8.fpclass;
                local_178.prec_elem = local_f8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_178,&local_68);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_178.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar19),&local_178), -1 < iVar11)) {
                  pnVar4 = (this->theURbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    uVar5 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                    local_178.data._M_elems[8] = (uint)uVar5;
                    local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                    uVar5 = *puVar13;
                    uVar8 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20);
                    local_178.data._M_elems[4] = (uint)uVar9;
                    local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                    local_178.data._M_elems[6] = (uint)uVar10;
                    local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                    local_178.data._M_elems[0] = (uint)uVar5;
                    local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                    local_178.data._M_elems[2] = (uint)uVar8;
                    local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                    local_178.exp =
                         *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
                    local_178.neg =
                         *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_f8);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_100,&local_178);
                }
                else {
                  pnVar4 = (this->theURbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                       CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                  puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                  puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                  *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                  puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_f8.neg;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                       local_f8._48_8_;
                }
                pnVar4 = (this->thePvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_178.data._M_elems[8] = local_138.data._M_elems[8];
                local_178.data._M_elems[9] = local_138.data._M_elems[9];
                local_178.data._M_elems[4] = local_138.data._M_elems[4];
                local_178.data._M_elems[5] = local_138.data._M_elems[5];
                local_178.data._M_elems[6] = local_138.data._M_elems[6];
                local_178.data._M_elems[7] = local_138.data._M_elems[7];
                local_178.data._M_elems[0] = local_138.data._M_elems[0];
                local_178.data._M_elems[1] = local_138.data._M_elems[1];
                local_178.data._M_elems[2] = local_138.data._M_elems[2];
                local_178.data._M_elems[3] = local_138.data._M_elems[3];
                local_178.exp = local_138.exp;
                local_178.neg = local_138.neg;
                local_178.fpclass = local_138.fpclass;
                local_178.prec_elem = local_138.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_68);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_178.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar19),&local_178), iVar11 < 1)) {
                  pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(this->theLRbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar19);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if (pcVar18 == &local_178) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_178,&local_138);
                    if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite
                       ) goto LAB_002398ab;
                  }
                  else {
                    local_178.data._M_elems[8] = local_138.data._M_elems[8];
                    local_178.data._M_elems[9] = local_138.data._M_elems[9];
                    local_178.data._M_elems[4] = local_138.data._M_elems[4];
                    local_178.data._M_elems[5] = local_138.data._M_elems[5];
                    local_178.data._M_elems[6] = local_138.data._M_elems[6];
                    local_178.data._M_elems[7] = local_138.data._M_elems[7];
                    local_178.data._M_elems[0] = local_138.data._M_elems[0];
                    local_178.data._M_elems[1] = local_138.data._M_elems[1];
                    local_178.data._M_elems[2] = local_138.data._M_elems[2];
                    local_178.data._M_elems[3] = local_138.data._M_elems[3];
                    local_178.exp = local_138.exp;
                    local_178.neg = local_138.neg;
                    local_178.fpclass = local_138.fpclass;
                    local_178.prec_elem = local_138.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_178,pcVar18);
                  }
                  goto LAB_002398b0;
                }
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                     CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_138._48_8_;
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_f8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),pcVar18)
                   , 0 < iVar11)) goto LAB_00239720;
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),
                                        &local_138), iVar11 < 0)) goto LAB_00239791;
              }
            }
            else {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),pcVar18),
                 iVar11 < 1)) {
LAB_00239791:
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 != &local_178) {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  goto LAB_00239803;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_138);
                if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
LAB_002398ab:
                  local_178.neg = (bool)(local_178.neg ^ 1);
                }
              }
              else {
LAB_00239720:
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_00239803:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
              }
LAB_002398b0:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_100,&local_178);
            }
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar17) {
          lVar19 = lVar17 * 0x38;
          lVar17 = lVar17 + 1;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
            local_f8.data._M_elems[8] = (uint)uVar5;
            local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
            uVar9 = *puVar13;
            uVar10 = puVar13[1];
            local_f8.data._M_elems[4] = (uint)uVar9;
            local_f8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_f8.data._M_elems[6] = (uint)uVar10;
            local_f8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            pcVar18 = &local_f8;
            local_f8.data._M_elems[0] = (uint)uVar5;
            local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[2] = (uint)uVar8;
            local_f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
            local_f8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8)
            ;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
            local_138.data._M_elems[8] = (uint)uVar5;
            local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
            uVar5 = *puVar13;
            uVar8 = puVar13[1];
            puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
            uVar9 = *puVar13;
            uVar10 = puVar13[1];
            local_138.data._M_elems[4] = (uint)uVar9;
            local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar10;
            local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_138.data._M_elems[0] = (uint)uVar5;
            local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar8;
            local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
            local_138._48_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
            if (((local_f8.fpclass == cpp_dec_float_NaN) || (local_138.fpclass == cpp_dec_float_NaN)
                ) || (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar18,&local_138), iVar11 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[lVar17 + -2] < 1) {
                pnVar4 = (this->theCoPvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_178.data._M_elems[8] = local_f8.data._M_elems[8];
                local_178.data._M_elems[9] = local_f8.data._M_elems[9];
                local_178.data._M_elems[4] = local_f8.data._M_elems[4];
                local_178.data._M_elems[5] = local_f8.data._M_elems[5];
                local_178.data._M_elems[6] = local_f8.data._M_elems[6];
                local_178.data._M_elems[7] = local_f8.data._M_elems[7];
                local_178.data._M_elems[0] = local_f8.data._M_elems[0];
                local_178.data._M_elems[1] = local_f8.data._M_elems[1];
                local_178.data._M_elems[2] = local_f8.data._M_elems[2];
                local_178.data._M_elems[3] = local_f8.data._M_elems[3];
                local_178.exp = local_f8.exp;
                local_178.neg = local_f8.neg;
                local_178.fpclass = local_f8.fpclass;
                local_178.prec_elem = local_f8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_178,&local_68);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_178.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar19),&local_178), -1 < iVar11)) {
                  pnVar4 = (this->theUCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                    uVar5 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                    local_178.data._M_elems[8] = (uint)uVar5;
                    local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                    uVar5 = *puVar13;
                    uVar8 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20);
                    local_178.data._M_elems[4] = (uint)uVar9;
                    local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                    local_178.data._M_elems[6] = (uint)uVar10;
                    local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                    local_178.data._M_elems[0] = (uint)uVar5;
                    local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                    local_178.data._M_elems[2] = (uint)uVar8;
                    local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                    local_178.exp =
                         *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10);
                    local_178.neg =
                         *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc);
                    local_178._48_8_ =
                         *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_178,&local_f8);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_100,&local_178);
                }
                else {
                  pnVar4 = (this->theUCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                       CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                  puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  *puVar13 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                  puVar13[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                  puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                  *puVar13 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                  puVar13[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_f8.exp;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_f8.neg;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                       local_f8._48_8_;
                }
                pnVar4 = (this->theCoPvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_178.data._M_elems[8] = local_138.data._M_elems[8];
                local_178.data._M_elems[9] = local_138.data._M_elems[9];
                local_178.data._M_elems[4] = local_138.data._M_elems[4];
                local_178.data._M_elems[5] = local_138.data._M_elems[5];
                local_178.data._M_elems[6] = local_138.data._M_elems[6];
                local_178.data._M_elems[7] = local_138.data._M_elems[7];
                local_178.data._M_elems[0] = local_138.data._M_elems[0];
                local_178.data._M_elems[1] = local_138.data._M_elems[1];
                local_178.data._M_elems[2] = local_138.data._M_elems[2];
                local_178.data._M_elems[3] = local_138.data._M_elems[3];
                local_178.exp = local_138.exp;
                local_178.neg = local_138.neg;
                local_178.fpclass = local_138.fpclass;
                local_178.prec_elem = local_138.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_68);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_178.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar19),&local_178), iVar11 < 1)) {
                  pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(this->theLCbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar19);
                  local_178.fpclass = cpp_dec_float_finite;
                  local_178.prec_elem = 10;
                  local_178.data._M_elems[0] = 0;
                  local_178.data._M_elems[1] = 0;
                  local_178.data._M_elems[2] = 0;
                  local_178.data._M_elems[3] = 0;
                  local_178.data._M_elems[4] = 0;
                  local_178.data._M_elems[5] = 0;
                  local_178.data._M_elems[6] = 0;
                  local_178.data._M_elems[7] = 0;
                  local_178.data._M_elems[8] = 0;
                  local_178.data._M_elems[9] = 0;
                  local_178.exp = 0;
                  local_178.neg = false;
                  if (pcVar18 == &local_178) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_178,&local_138);
                    if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite
                       ) goto LAB_0023a7ae;
                  }
                  else {
                    local_178.data._M_elems[8] = local_138.data._M_elems[8];
                    local_178.data._M_elems[9] = local_138.data._M_elems[9];
                    local_178.data._M_elems[4] = local_138.data._M_elems[4];
                    local_178.data._M_elems[5] = local_138.data._M_elems[5];
                    local_178.data._M_elems[6] = local_138.data._M_elems[6];
                    local_178.data._M_elems[7] = local_138.data._M_elems[7];
                    local_178.data._M_elems[0] = local_138.data._M_elems[0];
                    local_178.data._M_elems[1] = local_138.data._M_elems[1];
                    local_178.data._M_elems[2] = local_138.data._M_elems[2];
                    local_178.data._M_elems[3] = local_138.data._M_elems[3];
                    local_178.exp = local_138.exp;
                    local_178.neg = local_138.neg;
                    local_178.fpclass = local_138.fpclass;
                    local_178.prec_elem = local_138.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_178,pcVar18);
                  }
                  goto LAB_0023a7b3;
                }
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18) =
                     CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar13 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                *puVar13 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                *puVar13 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar13[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10) = local_138.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc) = local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) =
                     local_138._48_8_;
              }
              else {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_f8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),pcVar18)
                   , 0 < iVar11)) goto LAB_0023a625;
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),
                                        &local_138), iVar11 < 0)) goto LAB_0023a694;
              }
            }
            else {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar19),pcVar18),
                 iVar11 < 1)) {
LAB_0023a694:
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if (pcVar18 != &local_178) {
                  local_178.data._M_elems[8] = local_138.data._M_elems[8];
                  local_178.data._M_elems[9] = local_138.data._M_elems[9];
                  local_178.data._M_elems[4] = local_138.data._M_elems[4];
                  local_178.data._M_elems[5] = local_138.data._M_elems[5];
                  local_178.data._M_elems[6] = local_138.data._M_elems[6];
                  local_178.data._M_elems[7] = local_138.data._M_elems[7];
                  local_178.data._M_elems[0] = local_138.data._M_elems[0];
                  local_178.data._M_elems[1] = local_138.data._M_elems[1];
                  local_178.data._M_elems[2] = local_138.data._M_elems[2];
                  local_178.data._M_elems[3] = local_138.data._M_elems[3];
                  local_178.exp = local_138.exp;
                  local_178.neg = local_138.neg;
                  local_178.fpclass = local_138.fpclass;
                  local_178.prec_elem = local_138.prec_elem;
                  goto LAB_0023a706;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_138);
                if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
LAB_0023a7ae:
                  local_178.neg = (bool)(local_178.neg ^ 1);
                }
              }
              else {
LAB_0023a625:
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar19);
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems[6] = 0;
                local_178.data._M_elems[7] = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar13 != &local_178) {
                  uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x18);
                  local_178.data._M_elems[8] = (uint)uVar5;
                  local_178.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  uVar5 = *puVar13;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar19);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x20)
                  ;
                  local_178.data._M_elems[4] = (uint)uVar9;
                  local_178.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_178.data._M_elems[6] = (uint)uVar10;
                  local_178.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_178.data._M_elems[0] = (uint)uVar5;
                  local_178.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
                  local_178.data._M_elems[2] = (uint)uVar8;
                  local_178.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_178.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0x10)
                  ;
                  local_178.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -0xc)
                  ;
                  local_178._48_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_0023a706:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,pcVar18);
              }
LAB_0023a7b3:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_100,&local_178);
            }
            lVar17 = lVar17 + -1;
            lVar19 = lVar19 + -0x38;
          } while (1 < lVar17);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}